

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock.cc
# Opt level: O3

void * btreeblk_move(void *voidhandle,bid_t bid,bid_t *new_bid)

{
  bid_t *pbVar1;
  int iVar2;
  void *pvVar3;
  long *plVar4;
  long lVar5;
  long lVar6;
  bid_t bid_00;
  ulong uVar7;
  ulong uVar8;
  int sb_no;
  long lVar9;
  ulong uVar10;
  bid_t _new_bid;
  void *local_58;
  bid_t local_38;
  
  if ((char)(bid >> 0x30) == '\0') {
    pvVar3 = _btreeblk_read(voidhandle,bid,-1);
    local_58 = _btreeblk_alloc(voidhandle,new_bid,-1);
    *(long *)((long)voidhandle + 8) = *(long *)((long)voidhandle + 8) + -1;
    memcpy(local_58,pvVar3,(ulong)*voidhandle);
    filemgr_add_stale_block
              (*(filemgr **)((long)voidhandle + 0x38),bid * *voidhandle,(ulong)*voidhandle);
  }
  else {
    lVar9 = (ulong)((uint)(bid >> 0x35) & 7) - 1;
    uVar10 = (ulong)((ushort)(bid >> 0x30) & 0x1f);
    sb_no = (int)lVar9;
    pvVar3 = _btreeblk_read(voidhandle,bid & 0xffffffffffff,sb_no);
    lVar5 = *(long *)((long)voidhandle + 0x60);
    pbVar1 = (bid_t *)(lVar5 + lVar9 * 0x18);
    uVar8 = (ulong)*(ushort *)((long)pbVar1 + 0xc);
    if (uVar8 != 0) {
      uVar7 = 0;
      do {
        if (*(char *)(pbVar1[2] + uVar7) == '\0') {
          bid_00 = *pbVar1;
          if (uVar8 == uVar7 || bid_00 == 0xffffffffffffffff) goto LAB_0010e1c9;
          iVar2 = filemgr_is_writable(*(filemgr **)((long)voidhandle + 0x38),bid_00);
          lVar5 = *(long *)((long)voidhandle + 0x60);
          bid_00 = *(bid_t *)(lVar5 + lVar9 * 0x18);
          if (iVar2 == 0) goto LAB_0010e1c9;
          local_58 = _btreeblk_read(voidhandle,bid_00,sb_no);
          goto LAB_0010e252;
        }
        uVar7 = uVar7 + 1;
      } while (uVar8 != uVar7);
    }
    bid_00 = *pbVar1;
LAB_0010e1c9:
    if ((bid_00 != 0xffffffffffffffff) &&
       (plVar4 = (long *)(lVar5 + lVar9 * 0x18), *(short *)((long)plVar4 + 0xc) != 0)) {
      uVar8 = 0;
      do {
        if (*(char *)(plVar4[2] + uVar8) == '\0') {
          filemgr_add_stale_block
                    (*(filemgr **)((long)voidhandle + 0x38),
                     (ulong)((int)uVar8 * *(uint *)(plVar4 + 1)) + (ulong)*voidhandle * *plVar4,
                     (ulong)*(uint *)(plVar4 + 1));
          lVar5 = *(long *)((long)voidhandle + 0x60);
        }
        uVar8 = uVar8 + 1;
        plVar4 = (long *)(lVar5 + lVar9 * 0x18);
      } while (uVar8 < *(ushort *)((long)plVar4 + 0xc));
    }
    local_58 = _btreeblk_alloc(voidhandle,&local_38,sb_no);
    *(long *)((long)voidhandle + 8) = *(long *)((long)voidhandle + 8) + -1;
    lVar5 = *(long *)((long)voidhandle + 0x60);
    *(bid_t *)(lVar5 + lVar9 * 0x18) = local_38;
    uVar7 = 0;
    memset(*(void **)(lVar5 + 0x10 + lVar9 * 0x18),0,(ulong)*(ushort *)(lVar5 + 0xc + lVar9 * 0x18))
    ;
LAB_0010e252:
    lVar9 = lVar9 * 0x18;
    *(undefined1 *)(*(long *)(*(long *)((long)voidhandle + 0x60) + 0x10 + lVar9) + uVar7) = 1;
    lVar5 = *(long *)((long)voidhandle + 0x60);
    *new_bid = (ulong)(sb_no * 0x20 + 0x20U | (uint)uVar7) << 0x30 | *(ulong *)(lVar5 + lVar9);
    for (lVar6 = *(long *)((long)voidhandle + 0x28); lVar6 != 0; lVar6 = *(long *)(lVar6 + 8)) {
      if (*(ulong *)(lVar6 + -0x20) ==
          (*(ulong *)(lVar5 + lVar9) & 0xffffffffffff) / (ulong)*(ushort *)((long)voidhandle + 4)) {
        *(undefined1 *)(lVar6 + -0x10) = 1;
        break;
      }
    }
    uVar8 = (ulong)*(uint *)(lVar5 + 8 + lVar9);
    memcpy((void *)(uVar7 * uVar8 + (long)local_58),(void *)((long)pvVar3 + uVar10 * uVar8),uVar8);
    uVar8 = (ulong)*(uint *)(*(long *)((long)voidhandle + 0x60) + 8 + lVar9);
    filemgr_add_stale_block
              (*(filemgr **)((long)voidhandle + 0x38),
               uVar10 * uVar8 + (bid & 0xffffffffffff) * (ulong)*voidhandle,uVar8);
    local_58 = (void *)(*(uint *)(*(long *)((long)voidhandle + 0x60) + 8 + lVar9) * uVar7 +
                       (long)local_58);
  }
  return local_58;
}

Assistant:

void * btreeblk_move(void *voidhandle, bid_t bid, bid_t *new_bid)
{
    struct btreeblk_handle *handle = (struct btreeblk_handle *)voidhandle;
    void *old_addr, *new_addr;
    bid_t _old_bid, _new_bid;
    int i, subblock;
    size_t sb, old_sb_idx, new_sb_idx;

    old_addr = new_addr = NULL;
    sb = old_sb_idx = 0;
    subbid2bid(bid, &sb, &old_sb_idx, &_old_bid);
    subblock = is_subblock(bid);

    int convert_to_normal = 0;
#ifndef __BTREEBLK_SUBBLOCK
    convert_to_normal = 1;
#endif

    if (!subblock) {
        // normal block
        old_addr = btreeblk_read(voidhandle, bid);
        new_addr = btreeblk_alloc(voidhandle, new_bid);
        handle->nlivenodes--;

        // move
        memcpy(new_addr, old_addr, (handle->nodesize));

        // the entire block becomes stale
        _btreeblk_add_stale_block(handle, bid * handle->nodesize, handle->nodesize);

        return new_addr;
    } else {
        // subblock

        // move the target subblock
        // into the current subblock set
        old_addr = _btreeblk_read(voidhandle, _old_bid, sb);

        new_sb_idx = handle->sb[sb].nblocks;
        for (i=0;i<handle->sb[sb].nblocks;++i){
            if (handle->sb[sb].bitmap[i] == 0) {
                new_sb_idx = i;
                break;
            }
        }
        if ( handle->sb[sb].bid == BLK_NOT_FOUND ||
             new_sb_idx == handle->sb[sb].nblocks ||
             !filemgr_is_writable(handle->file, handle->sb[sb].bid) ||
             convert_to_normal ) {
            // There is no free slot in the parent block, OR
            // the parent block is not writable, OR
            // `convert_to_normal` flag is on.

            // Mark all unused subblocks in the current parent block as stale
            if (handle->sb[sb].bid != BLK_NOT_FOUND) {
                for (i=0; i<handle->sb[sb].nblocks; ++i) {
                    if (handle->sb[sb].bitmap[i] == 0) {
                        _btreeblk_add_stale_block
                        ( handle,
                          ( (handle->sb[sb].bid * handle->nodesize) +
                            (i * handle->sb[sb].sb_size) ),
                          handle->sb[sb].sb_size );
                    }
                }
            }

            if (convert_to_normal) {
                // Whole block.
                new_addr = btreeblk_alloc(voidhandle, &_new_bid);
                handle->nlivenodes--;
            } else {
                // Allocate new parent block.
                new_addr = _btreeblk_alloc(voidhandle, &_new_bid, sb);
                handle->nlivenodes--;
                handle->sb[sb].bid = _new_bid;
                memset(handle->sb[sb].bitmap, 0, handle->sb[sb].nblocks);
            }
            new_sb_idx = 0;

        } else {
            // just append to the current block
            new_addr = _btreeblk_read(voidhandle, handle->sb[sb].bid, sb);
        }

        if (convert_to_normal) {
            *new_bid = _new_bid;
        } else {
            handle->sb[sb].bitmap[new_sb_idx] = 1;
            bid2subbid(handle->sb[sb].bid, sb, new_sb_idx, new_bid);
            btreeblk_set_dirty(voidhandle, handle->sb[sb].bid);
        }

        // move
        memcpy( (uint8_t*)new_addr + handle->sb[sb].sb_size * new_sb_idx,
                (uint8_t*)old_addr + handle->sb[sb].sb_size * old_sb_idx,
                handle->sb[sb].sb_size );

        // Also mark the target (old) subblock as stale
        _btreeblk_add_stale_block
        ( handle,
          (_old_bid * handle->nodesize) + (old_sb_idx * handle->sb[sb].sb_size),
           handle->sb[sb].sb_size );

        return (uint8_t*)new_addr + handle->sb[sb].sb_size * new_sb_idx;
    }
}